

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::DecompressRle
               (uchar *dst,unsigned_long uncompressed_size,uchar *src,unsigned_long src_size)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  uchar *puVar4;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  allocator<unsigned_char> local_49;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  unsigned_long src_size_local;
  uchar *src_local;
  unsigned_long uncompressed_size_local;
  uchar *dst_local;
  
  tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)src_size;
  if (uncompressed_size == src_size) {
    memcpy(dst,src,src_size);
    dst_local._7_1_ = true;
  }
  else if (src_size < 3) {
    dst_local._7_1_ = false;
  }
  else {
    std::allocator<unsigned_char>::allocator(&local_49);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,uncompressed_size,
               &local_49);
    std::allocator<unsigned_char>::~allocator(&local_49);
    iVar1 = (int)tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0);
    iVar1 = rleUncompress(iVar1,(int)uncompressed_size,(char *)src,(char *)pvVar2);
    if (iVar1 == (int)uncompressed_size) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0);
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0);
      while (stop = pvVar2 + 1, stop < pvVar3 + uncompressed_size) {
        *stop = *pvVar2 + *stop + 0x80;
        pvVar2 = stop;
      }
      t2 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0);
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0);
      stop_1 = (char *)dst;
      s = (char *)(pvVar2 + (uncompressed_size + 1 >> 1));
      while (stop_1 < dst + uncompressed_size) {
        puVar4 = (uchar *)(stop_1 + 1);
        *stop_1 = *t2;
        if (dst + uncompressed_size <= puVar4) break;
        stop_1 = stop_1 + 2;
        *puVar4 = *s;
        s = s + 1;
        t2 = t2 + 1;
      }
      dst_local._7_1_ = true;
    }
    else {
      dst_local._7_1_ = false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  }
  return dst_local._7_1_;
}

Assistant:

static bool DecompressRle(unsigned char *dst,
                          const unsigned long uncompressed_size,
                          const unsigned char *src, unsigned long src_size) {
  if (uncompressed_size == src_size) {
    // Data is not compressed(Issue 40).
    memcpy(dst, src, src_size);
    return true;
  }

  // Workaround for issue #112.
  // TODO(syoyo): Add more robust out-of-bounds check in `rleUncompress`.
  if (src_size <= 2) {
    return false;
  }

  std::vector<unsigned char> tmpBuf(uncompressed_size);

  int ret = rleUncompress(static_cast<int>(src_size),
                          static_cast<int>(uncompressed_size),
                          reinterpret_cast<const signed char *>(src),
                          reinterpret_cast<char *>(&tmpBuf.at(0)));
  if (ret != static_cast<int>(uncompressed_size)) {
    return false;
  }

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfRleCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + uncompressed_size;

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + uncompressed_size;

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }

  return true;
}